

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost2015_final_call(EVP_CIPHER_CTX *ctx,EVP_MD_CTX *omac_ctx,size_t mac_size,
                       uchar *encrypted_mac,
                       _func_int_EVP_CIPHER_CTX_ptr_uchar_ptr_uchar_ptr_size_t *do_cipher)

{
  int iVar1;
  undefined8 in_RCX;
  size_t in_RDX;
  EVP_MD_CTX *in_RSI;
  undefined8 in_RDI;
  code *in_R8;
  uchar expected_mac [16];
  uchar calculated_mac [16];
  undefined1 auStack_58 [16];
  uchar local_48 [24];
  code *local_30;
  undefined8 local_28;
  size_t local_20;
  EVP_MD_CTX *local_18;
  undefined8 local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_48,0,0x10);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(local_10);
  if (iVar1 == 0) {
    memset(auStack_58,0,0x10);
    EVP_DigestSignFinal(local_18,local_48,&local_20);
    iVar1 = (*local_30)(local_10,auStack_58,local_28,local_20);
    if (iVar1 < 1) {
      return -1;
    }
    iVar1 = CRYPTO_memcmp(auStack_58,local_48,local_20);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    EVP_DigestSignFinal(local_18,local_48,&local_20);
    iVar1 = (*local_30)(local_10,local_28,local_48,local_20);
    if (iVar1 < 1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int gost2015_final_call(EVP_CIPHER_CTX *ctx, EVP_MD_CTX *omac_ctx, size_t mac_size,
    unsigned char *encrypted_mac,
    int (*do_cipher) (EVP_CIPHER_CTX *ctx,
    unsigned char *out,
    const unsigned char *in,
    size_t inl))
{
    unsigned char calculated_mac[KUZNYECHIK_MAC_MAX_SIZE];
    memset(calculated_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);

    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, encrypted_mac, calculated_mac, mac_size) <= 0) {
            return -1;
        }
    } else {
        unsigned char expected_mac[KUZNYECHIK_MAC_MAX_SIZE];

        memset(expected_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, expected_mac, encrypted_mac, mac_size) <= 0) {
            return -1;
        }

        if (CRYPTO_memcmp(expected_mac, calculated_mac, mac_size) != 0)
            return -1;
    }
    return 0;
}